

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O1

void __thiscall
QObjectPrivate::ConnectionData::cleanOrphanedConnectionsImpl
          (ConnectionData *this,QObject *sender,LockPolicy lockPolicy)

{
  __pointer_type copy;
  QBasicMutex *this_00;
  undefined8 *puVar1;
  Connection *this_01;
  Connection *pCVar2;
  long in_FS_OFFSET;
  bool bVar3;
  unique_lock<QBasicMutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QBasicMutex *)
            ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
            (ulong)((int)sender + (int)(((ulong)sender & 0xffffffff) / 0x418) * -0x418 & 0x7f8));
  local_38._M_owns = false;
  local_38._9_7_ = 0xaaaaaaaaaaaaaa;
  local_38._M_device = this_00;
  if (lockPolicy == NeedToLock) {
    std::unique_lock<QBasicMutex>::lock(&local_38);
  }
  if ((this->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i < 2) {
    LOCK();
    this_01 = (Connection *)(this->orphaned)._M_i.c;
    (this->orphaned)._M_i.c = 0;
    UNLOCK();
    std::unique_lock<QBasicMutex>::~unique_lock(&local_38);
    if (this_01 != (Connection *)0x0) {
      if (lockPolicy == AlreadyLockedAndTemporarilyReleasingLock) {
        LOCK();
        copy = (this_00->d_ptr)._q_value._M_b._M_p;
        (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        if (copy != (__pointer_type)0x1) {
          QBasicMutex::unlockInternalFutex(this_00,copy);
        }
        do {
          puVar1 = (undefined8 *)((ulong)this_01 & 0xfffffffffffffffe);
          if (puVar1 == (undefined8 *)0x0 || ((ulong)this_01 & 1) == 0) {
            pCVar2 = (this_01->super_ConnectionOrSignalVector).field_0.next;
            Connection::freeSlotObject(this_01);
            Connection::deref(this_01);
          }
          else {
            pCVar2 = (Connection *)*puVar1;
            free(puVar1);
          }
          this_01 = pCVar2;
        } while (pCVar2 != (Connection *)0x0);
        if ((this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0) {
          LOCK();
          bVar3 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
          if (bVar3) {
            (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
          }
          UNLOCK();
          if (bVar3) goto LAB_002b3751;
        }
        QBasicMutex::lockInternal(this_00);
      }
      else {
        do {
          puVar1 = (undefined8 *)((ulong)this_01 & 0xfffffffffffffffe);
          if (puVar1 == (undefined8 *)0x0 || ((ulong)this_01 & 1) == 0) {
            pCVar2 = (this_01->super_ConnectionOrSignalVector).field_0.next;
            Connection::freeSlotObject(this_01);
            Connection::deref(this_01);
          }
          else {
            pCVar2 = (Connection *)*puVar1;
            free(puVar1);
          }
          this_01 = pCVar2;
        } while (pCVar2 != (Connection *)0x0);
      }
    }
  }
  else {
    std::unique_lock<QBasicMutex>::~unique_lock(&local_38);
  }
LAB_002b3751:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QObjectPrivate::ConnectionData::cleanOrphanedConnectionsImpl(QObject *sender, LockPolicy lockPolicy)
{
    QBasicMutex *senderMutex = signalSlotLock(sender);
    TaggedSignalVector c = nullptr;
    {
        std::unique_lock<QBasicMutex> lock(*senderMutex, std::defer_lock_t{});
        if (lockPolicy == NeedToLock)
            lock.lock();
        if (ref.loadAcquire() > 1)
            return;

        // Since ref == 1, no activate() is in process since we locked the mutex. That implies,
        // that nothing can reference the orphaned connection objects anymore and they can
        // be safely deleted
        c = orphaned.exchange(nullptr, std::memory_order_relaxed);
    }
    if (c) {
        // Deleting c might run arbitrary user code, so we must not hold the lock
        if (lockPolicy == AlreadyLockedAndTemporarilyReleasingLock) {
            senderMutex->unlock();
            deleteOrphaned(c);
            senderMutex->lock();
        } else {
            deleteOrphaned(c);
        }
    }
}